

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::MatrixMultiply::dim_forward
          (Dim *__return_storage_ptr__,MatrixMultiply *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer pDVar2;
  uint v;
  long lVar3;
  invalid_argument *this_00;
  uint uVar4;
  ostringstream s;
  string local_1b0 [32];
  uint local_190 [94];
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/nodes-common.cc"
                  ,0x2db,"virtual Dim cnn::MatrixMultiply::dim_forward(const vector<Dim> &) const");
  }
  uVar4 = 1;
  if (1 < pDVar2->nd) {
    uVar4 = pDVar2->d[1];
  }
  if (uVar4 == pDVar2[1].d[0]) {
    if (pDVar2[1].nd == 1) {
      uVar4 = pDVar2[1].bd;
      if (pDVar2[1].bd < pDVar2->bd) {
        uVar4 = pDVar2->bd;
      }
      uVar1 = pDVar2->d[0];
      __return_storage_ptr__->bd = uVar4;
      __return_storage_ptr__->nd = 1;
      __return_storage_ptr__->d[0] = uVar1;
    }
    else {
      local_190[0] = pDVar2->d[0];
      local_190[1] = 1;
      if (pDVar2[1].nd != 0) {
        local_190[1] = pDVar2[1].d[1];
      }
      uVar4 = pDVar2[1].bd;
      if (pDVar2[1].bd < pDVar2->bd) {
        uVar4 = pDVar2->bd;
      }
      __return_storage_ptr__->nd = 0;
      __return_storage_ptr__->bd = uVar4;
      lVar3 = 0;
      do {
        uVar4 = *(uint *)((long)local_190 + lVar3);
        uVar1 = __return_storage_ptr__->nd;
        __return_storage_ptr__->nd = uVar1 + 1;
        __return_storage_ptr__->d[uVar1] = uVar4;
        lVar3 = lVar3 + 4;
      } while (lVar3 != 8);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Mismatched input dimensions in MatrixMultiply: ",0x2f);
  operator<<((ostream *)local_190,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string BinaryLogLoss::as_string(const vector<string>& arg_names) const {
  ostringstream os;
  os << "binary_log_loss(" << arg_names[0] << ", " << arg_names[1] << ')';
  return os.str();
}